

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyDefinition.cxx
# Opt level: O0

void __thiscall
cmPropertyDefinition::DefineProperty
          (cmPropertyDefinition *this,string *name,ScopeType scope,char *shortDescription,
          char *fullDescription,bool chain)

{
  bool chain_local;
  char *fullDescription_local;
  char *shortDescription_local;
  ScopeType scope_local;
  string *name_local;
  cmPropertyDefinition *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)name);
  this->Scope = scope;
  this->Chained = chain;
  if (shortDescription != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->ShortDescription,shortDescription);
  }
  if (fullDescription != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->FullDescription,fullDescription);
  }
  return;
}

Assistant:

void cmPropertyDefinition
::DefineProperty(const std::string& name, cmProperty::ScopeType scope,
                 const char *shortDescription,
                 const char *fullDescription,
                 bool chain)
{
  this->Name = name;
  this->Scope = scope;
  this->Chained = chain;
  if (shortDescription)
    {
    this->ShortDescription = shortDescription;
    }
  if (fullDescription)
    {
    this->FullDescription = fullDescription;
    }
}